

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Trainer::Node::Node(Node *this,int actionNum)

{
  size_t __n;
  double *__s;
  double *pdVar1;
  double *__s_00;
  double *__s_01;
  ulong uVar2;
  
  this->mActionNum = (uint8_t)actionNum;
  this->mAlreadyCalculated = false;
  this->mNeedToUpdateStrategy = false;
  uVar2 = 0xffffffffffffffff;
  if (-1 < actionNum) {
    uVar2 = (long)actionNum * 8;
  }
  __s = (double *)operator_new__(uVar2);
  this->mRegretSum = __s;
  pdVar1 = (double *)operator_new__(uVar2);
  this->mStrategy = pdVar1;
  __s_00 = (double *)operator_new__(uVar2);
  this->mStrategySum = __s_00;
  __s_01 = (double *)operator_new__(uVar2);
  this->mAverageStrategy = __s_01;
  if (0 < actionNum) {
    __n = (ulong)(uint)actionNum * 8;
    uVar2 = 0;
    memset(__s,0,__n);
    memset(__s_00,0,__n);
    memset(__s_01,0,__n);
    do {
      pdVar1[uVar2] = 1.0 / (double)actionNum;
      uVar2 = uVar2 + 1;
    } while ((uint)actionNum != uVar2);
  }
  return;
}

Assistant:

Node::Node(const int actionNum) : mActionNum(actionNum), mAlreadyCalculated(false), mNeedToUpdateStrategy(false) {
    mRegretSum = new double[actionNum];
    mStrategy = new double[actionNum];
    mStrategySum = new double[actionNum];
    mAverageStrategy = new double[actionNum];
    for (int a = 0; a < actionNum; ++a) {
        mRegretSum[a] = 0.0;
        mStrategy[a] = 1.0 / (double) actionNum;
        mStrategySum[a] = 0.0;
        mAverageStrategy[a] = 0.0;
    }
}